

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

char * transform_schema2json(lys_module *module,char *expr)

{
  ly_ctx *ctx;
  char *pcVar1;
  lyxp_expr *expr_00;
  lys_module *plVar2;
  size_t sVar3;
  ushort **ppuVar4;
  char cVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  char *pcVar11;
  bool bVar12;
  size_t local_58;
  long local_38;
  
  ctx = module->ctx;
  local_58 = strlen(expr);
  local_58 = local_58 + 1;
  pcVar1 = (char *)malloc(local_58);
  if (pcVar1 == (char *)0x0) {
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","transform_schema2json");
  }
  else {
    expr_00 = lyxp_parse_expr(ctx,expr);
    if (expr_00 != (lyxp_expr *)0x0) {
      if (expr_00->used == 0) {
        local_38 = 0;
      }
      else {
        uVar7 = 0;
        local_38 = 0;
        do {
          pcVar11 = expr_00->expr + expr_00->expr_pos[uVar7];
          if ((uVar7 != 0) &&
             (uVar6 = (int)uVar7 - 1,
             pcVar8 = expr_00->expr +
                      (ulong)expr_00->tok_len[uVar6] + (ulong)expr_00->expr_pos[uVar6],
             pcVar8 != pcVar11)) {
            strncpy(pcVar1 + local_38,pcVar8,(long)pcVar11 - (long)pcVar8);
            local_38 = local_38 + ((long)pcVar11 - (long)pcVar8);
          }
          if (expr_00->tokens[uVar7] == LYXP_TOKEN_LITERAL) {
            cVar5 = *pcVar11;
            pcVar8 = pcVar11;
            if (cVar5 != ':') {
              uVar6 = (uint)expr_00->tok_len[uVar7];
              pcVar9 = pcVar11;
              do {
                bVar12 = uVar6 == 0;
                uVar6 = uVar6 - 1;
                if (cVar5 == '\0') {
                  pcVar8 = (char *)0x0;
                  break;
                }
                pcVar8 = (char *)0x0;
                if (bVar12) break;
                cVar5 = pcVar9[1];
                pcVar9 = pcVar9 + 1;
                pcVar8 = pcVar9;
              } while (cVar5 != ':');
            }
            if (pcVar8 != (char *)0x0) {
              ppuVar4 = __ctype_b_loc();
              lVar10 = 0;
              while ((((*ppuVar4)[pcVar8[lVar10 + -1]] & 8) != 0 ||
                     ((uVar6 = (byte)pcVar8[lVar10 + -1] - 0x2d, uVar6 < 0x33 &&
                      ((0x4000000000003U >> ((ulong)uVar6 & 0x3f) & 1) != 0))))) {
                lVar10 = lVar10 + -1;
              }
              plVar2 = lyp_get_module(module,pcVar8 + lVar10,(int)-lVar10,(char *)0x0,0,0);
              if (plVar2 != (lys_module *)0x0) {
                sVar3 = strlen(plVar2->name);
                local_58 = local_58 + lVar10 + sVar3;
                pcVar9 = (char *)realloc(pcVar1,local_58);
                if (pcVar9 != (char *)0x0) {
                  strncpy(pcVar9 + local_38,pcVar11,(size_t)(pcVar8 + (lVar10 - (long)pcVar11)));
                  strcpy(pcVar9 + (long)(pcVar8 + lVar10 + (local_38 - (long)pcVar11)),plVar2->name)
                  ;
                  sVar3 = strlen(plVar2->name);
                  strncpy(pcVar9 + (long)(pcVar8 + lVar10 + (local_38 - (long)pcVar11)) + sVar3,
                          pcVar8,(ulong)expr_00->tok_len[uVar7] -
                                 (-lVar10 + (long)(pcVar8 + (lVar10 - (long)pcVar11))));
                  local_38 = local_38 + sVar3 + lVar10 + (ulong)expr_00->tok_len[uVar7];
                  pcVar1 = pcVar9;
                  goto LAB_00109ccd;
                }
                free(pcVar1);
                pcVar1 = (char *)0x0;
                ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                       "transform_schema2json");
                goto LAB_00109dbc;
              }
            }
LAB_00109c9d:
            strncpy(pcVar1 + local_38,expr_00->expr + expr_00->expr_pos[uVar7],
                    (ulong)expr_00->tok_len[uVar7]);
            local_38 = local_38 + (ulong)expr_00->tok_len[uVar7];
          }
          else {
            if (expr_00->tokens[uVar7] != LYXP_TOKEN_NAMETEST) goto LAB_00109c9d;
            cVar5 = *pcVar11;
            pcVar8 = pcVar11;
            if (cVar5 != ':') {
              uVar6 = (uint)expr_00->tok_len[uVar7];
              pcVar9 = pcVar11;
              do {
                bVar12 = uVar6 == 0;
                uVar6 = uVar6 - 1;
                if (cVar5 == '\0') {
                  pcVar8 = (char *)0x0;
                  break;
                }
                pcVar8 = (char *)0x0;
                if (bVar12) break;
                cVar5 = pcVar9[1];
                pcVar9 = pcVar9 + 1;
                pcVar8 = pcVar9;
              } while (cVar5 != ':');
            }
            if (pcVar8 == (char *)0x0) goto LAB_00109c9d;
            lVar10 = (long)pcVar8 - (long)pcVar11;
            plVar2 = lyp_get_module(module,pcVar11,(int)lVar10,(char *)0x0,0,0);
            if (plVar2 == (lys_module *)0x0) {
              ly_vlog(ctx,LYE_INMOD_LEN,LY_VLOG_NONE,(void *)0x0,lVar10,pcVar11);
              goto LAB_00109dbc;
            }
            sVar3 = strlen(plVar2->name);
            local_58 = local_58 + (sVar3 - lVar10);
            pcVar11 = (char *)realloc(pcVar1,local_58);
            if (pcVar11 == (char *)0x0) {
              free(pcVar1);
              pcVar1 = (char *)0x0;
              ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","transform_schema2json"
                    );
              goto LAB_00109dbc;
            }
            strcpy(pcVar11 + local_38,plVar2->name);
            sVar3 = strlen(plVar2->name);
            strncpy(pcVar11 + sVar3 + local_38,pcVar8,(ulong)expr_00->tok_len[uVar7] - lVar10);
            local_38 = ((sVar3 + local_38) - lVar10) + (ulong)expr_00->tok_len[uVar7];
            pcVar1 = pcVar11;
          }
LAB_00109ccd:
          uVar7 = uVar7 + 1;
        } while (uVar7 < expr_00->used);
      }
      pcVar1[local_38] = '\0';
      lyxp_expr_free(expr_00);
      pcVar1 = lydict_insert_zc(module->ctx,pcVar1);
      return pcVar1;
    }
LAB_00109dbc:
    free(pcVar1);
    lyxp_expr_free(expr_00);
  }
  return (char *)0x0;
}

Assistant:

const char *
transform_schema2json(const struct lys_module *module, const char *expr)
{
    const char *end, *cur_expr, *ptr;
    char *out;
    uint16_t i;
    size_t out_size, out_used, pref_len;
    const struct lys_module *mod;
    struct ly_ctx *ctx = module->ctx;
    struct lyxp_expr *exp = NULL;

    out_size = strlen(expr) + 1;
    out = malloc(out_size);
    LY_CHECK_ERR_RETURN(!out, LOGMEM(ctx), NULL);
    out_used = 0;

    exp = lyxp_parse_expr(ctx, expr);
    LY_CHECK_ERR_GOTO(!exp, , error);

    for (i = 0; i < exp->used; ++i) {
        cur_expr = &exp->expr[exp->expr_pos[i]];

        /* copy WS */
        if (i && ((end = exp->expr + exp->expr_pos[i - 1] + exp->tok_len[i - 1]) != cur_expr)) {
            strncpy(&out[out_used], end, cur_expr - end);
            out_used += cur_expr - end;
        }

        if ((exp->tokens[i] == LYXP_TOKEN_NAMETEST) && (end = strnchr(cur_expr, ':', exp->tok_len[i]))) {
            /* get the module */
            pref_len = end - cur_expr;
            mod = lyp_get_module(module, cur_expr, pref_len, NULL, 0, 0);
            if (!mod) {
                LOGVAL(ctx, LYE_INMOD_LEN, LY_VLOG_NONE, NULL, pref_len, cur_expr);
                goto error;
            }

            /* adjust out size (it can even decrease in some strange cases) */
            out_size += strlen(mod->name) - pref_len;
            out = ly_realloc(out, out_size);
            LY_CHECK_ERR_GOTO(!out, LOGMEM(ctx), error);

            /* copy the model name */
            strcpy(&out[out_used], mod->name);
            out_used += strlen(mod->name);

            /* copy the rest */
            strncpy(&out[out_used], end, exp->tok_len[i] - pref_len);
            out_used += exp->tok_len[i] - pref_len;
        } else if ((exp->tokens[i] == LYXP_TOKEN_LITERAL) && (end = strnchr(cur_expr, ':', exp->tok_len[i]))) {
            ptr = end;
            while (isalnum(ptr[-1]) || (ptr[-1] == '_') || (ptr[-1] == '-') || (ptr[-1] == '.')) {
                --ptr;
            }

            /* get the module */
            pref_len = end - ptr;
            mod = lyp_get_module(module, ptr, pref_len, NULL, 0, 0);
            if (mod) {
                /* adjust out size (it can even decrease in some strange cases) */
                out_size += strlen(mod->name) - pref_len;
                out = ly_realloc(out, out_size);
                LY_CHECK_ERR_GOTO(!out, LOGMEM(ctx), error);

                /* copy any beginning */
                strncpy(&out[out_used], cur_expr, ptr - cur_expr);
                out_used += ptr - cur_expr;

                /* copy the model name */
                strcpy(&out[out_used], mod->name);
                out_used += strlen(mod->name);

                /* copy the rest */
                strncpy(&out[out_used], end, (exp->tok_len[i] - pref_len) - (ptr - cur_expr));
                out_used += (exp->tok_len[i] - pref_len) - (ptr - cur_expr);
            } else {
                strncpy(&out[out_used], &exp->expr[exp->expr_pos[i]], exp->tok_len[i]);
                out_used += exp->tok_len[i];
            }
        } else {
            strncpy(&out[out_used], &exp->expr[exp->expr_pos[i]], exp->tok_len[i]);
            out_used += exp->tok_len[i];
        }
    }
    out[out_used] = '\0';

    lyxp_expr_free(exp);
    return lydict_insert_zc(module->ctx, out);

error:
    free(out);
    lyxp_expr_free(exp);
    return NULL;
}